

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>
                   (string *__return_storage_ptr__,char (*a) [8],char **b,char (*args) [21],
                   char **args_1,char (*args_2) [28],char **args_3,char (*args_4) [156],
                   char **args_5,char (*args_6) [73],char **args_7,char (*args_8) [75])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_3a0;
  cmAlphaNum local_368;
  cmAlphaNum local_330;
  cmAlphaNum local_2f8;
  cmAlphaNum local_2c0;
  cmAlphaNum local_288;
  cmAlphaNum local_250;
  cmAlphaNum local_218;
  cmAlphaNum local_1e0;
  cmAlphaNum local_1a8;
  cmAlphaNum local_170;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_138;
  string_view local_120;
  string *local_110;
  string_view local_108;
  string *local_f8;
  string_view local_f0;
  string *local_e0;
  string_view local_d8;
  string *local_c8;
  string_view local_c0;
  string *local_b0;
  string_view local_a8;
  string *local_98;
  string_view local_90;
  string *local_80;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  cmAlphaNum::cmAlphaNum(&local_170,*a);
  local_138.first = cmAlphaNum::View(&local_170);
  local_138.second = local_170.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_1a8,*b);
  local_120 = cmAlphaNum::View(&local_1a8);
  local_110 = local_1a8.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_1e0,*args);
  local_108 = cmAlphaNum::View(&local_1e0);
  local_f8 = local_1e0.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_218,*args_1);
  local_f0 = cmAlphaNum::View(&local_218);
  local_e0 = local_218.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_250,*args_2);
  local_d8 = cmAlphaNum::View(&local_250);
  local_c8 = local_250.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_288,*args_3);
  local_c0 = cmAlphaNum::View(&local_288);
  local_b0 = local_288.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_2c0,*args_4);
  local_a8 = cmAlphaNum::View(&local_2c0);
  local_98 = local_2c0.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_2f8,*args_5);
  local_90 = cmAlphaNum::View(&local_2f8);
  local_80 = local_2f8.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_330,*args_6);
  local_78 = cmAlphaNum::View(&local_330);
  local_68 = local_330.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_368,*args_7);
  local_60 = cmAlphaNum::View(&local_368);
  local_50 = local_368.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_3a0,*args_8);
  local_48 = cmAlphaNum::View(&local_3a0);
  local_38 = local_3a0.RValueString_;
  views._M_len = 0xb;
  views._M_array = &local_138;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}